

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5UpdateMethod(sqlite3_vtab *pVtab,int nArg,sqlite3_value **apVal,sqlite_int64 *pRowid)

{
  long *plVar1;
  i64 *piVar2;
  int *piVar3;
  sqlite3_module *psVar4;
  sqlite3_value *pVal;
  Fts5Storage *pFVar5;
  Fts5Config *pFVar6;
  long lVar7;
  ushort *puVar8;
  u8 *puVar9;
  long lVar10;
  ushort uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  _func_int_sqlite3_vtab_cursor_ptr *p_Var18;
  char *pcVar19;
  Fts5Structure *pFVar20;
  i64 iDel;
  Fts5Structure *pFVar21;
  void *__s;
  Mem *pMVar22;
  i64 iVar23;
  uchar *puVar24;
  ulong uVar25;
  Fts5Data *pFVar26;
  Fts5DlidxIter *pIter;
  ulong uVar27;
  int iVar28;
  Mem *pMem;
  Fts5Index *pFVar29;
  sqlite3_stmt *psVar30;
  Fts5Iter *pFVar31;
  Fts5StructureLevel *pFVar32;
  long lVar33;
  long lVar34;
  Fts5StructureSegment *pFVar35;
  uint uVar36;
  ulong uVar37;
  bool bVar38;
  int local_144;
  Fts5Iter *local_140;
  i64 nRow;
  undefined8 uStack_130;
  Fts5Buffer poslist;
  int nKeep;
  Fts5IntegrityCtx ctx;
  Fts5Buffer buf2;
  sqlite3_stmt *pStmt;
  Fts5Structure *local_a8;
  ulong local_a0;
  int local_94;
  ulong local_90;
  sqlite3_stmt *pScan;
  Fts5Index *local_80;
  int local_78;
  int nTerm;
  u32 local_70;
  int nIncr;
  Fts5StructureLevel *local_68;
  Fts5StructureSegment *local_60;
  ulong local_58;
  long local_50;
  Fts5StructureLevel *local_48;
  long local_40;
  i64 local_38;
  
  psVar4 = pVtab[1].pModule;
  local_144 = 0;
  psVar4->xSavepoint = (_func_int_sqlite3_vtab_ptr_int *)&pVtab->zErrMsg;
  for (p_Var18 = (pVtab[2].pModule)->xNext; p_Var18 != (_func_int_sqlite3_vtab_cursor_ptr *)0x0;
      p_Var18 = *(_func_int_sqlite3_vtab_cursor_ptr **)(p_Var18 + 8)) {
    if ((*(int *)(p_Var18 + 0x20) == 1) && (*(sqlite3_vtab **)p_Var18 == pVtab)) {
      p_Var18[0x50] = (_func_int_sqlite3_vtab_cursor_ptr)((byte)p_Var18[0x50] | 0x20);
    }
  }
  uVar13 = (uint)(*apVal)->flags;
  if (((0xaaaaaaaaU >> (uVar13 & 0x1f) & 1) == 0) ||
     (pVal = apVal[(long)*(int *)&psVar4->xBestIndex + 2], uVar36._0_2_ = pVal->flags,
     uVar36._2_1_ = pVal->enc, uVar36._3_1_ = pVal->eSubtype,
     (0xaaaaaaaaU >> (uVar36 & 0x1f) & 1) != 0)) {
    uVar13 = uVar13 & 0x1f;
    if (*(int *)&psVar4->xFilter == 0) {
      bVar38 = *(char *)(*(long *)psVar4 + 0x66) == '\x05';
    }
    else {
      bVar38 = false;
    }
    if (*(int *)&psVar4->xFilter == 1 && (0x50505050U >> uVar13 & 1) != 0) {
      pcVar19 = "DELETE from";
      if (1 < nArg) {
        pcVar19 = "UPDATE";
      }
      pcVar19 = sqlite3_mprintf("cannot %s contentless fts5 table: %s",pcVar19,psVar4->xConnect);
      pVtab->zErrMsg = pcVar19;
      local_144 = 1;
      iVar12 = local_144;
    }
    else if (nArg == 1) {
      iVar23 = sqlite3VdbeIntValue(*apVal);
      iVar12 = sqlite3Fts5StorageDelete
                         ((Fts5Storage *)pVtab[1].zErrMsg,iVar23,(sqlite3_value **)0x0);
    }
    else {
      pMVar22 = apVal[1];
      uVar11 = pMVar22->flags;
      if ((uVar11 & 0xf) == 2) {
        applyNumericAffinity(pMVar22,0);
        uVar11 = pMVar22->flags;
      }
      if ((0xfafafafaU >> (uVar11 & 0x1f) & 1) == 0) {
        local_144 = 0x14;
        iVar12 = local_144;
      }
      else {
        uVar36 = uVar11 & 0x1f;
        if ((0x50505050UL >> (sbyte)uVar13 & 1) == 0) {
          if (bVar38 && (0x50505050U >> uVar36 & 1) != 0) {
            iVar23 = sqlite3VdbeIntValue(apVal[1]);
            local_144 = sqlite3Fts5StorageDelete
                                  ((Fts5Storage *)pVtab[1].zErrMsg,iVar23,(sqlite3_value **)0x0);
          }
        }
        else {
          local_140 = (Fts5Iter *)pRowid;
          iVar23 = sqlite3VdbeIntValue(*apVal);
          iDel = sqlite3VdbeIntValue(apVal[1]);
          pFVar5 = (Fts5Storage *)pVtab[1].zErrMsg;
          if (iVar23 == iDel || (0xafafafafUL >> (sbyte)uVar36 & 1) != 0) {
            local_144 = sqlite3Fts5StorageDelete(pFVar5,iVar23,(sqlite3_value **)0x0);
            pRowid = (sqlite_int64 *)local_140;
          }
          else {
            if (!bVar38) {
              local_144 = sqlite3Fts5StorageContentInsert(pFVar5,apVal,(i64 *)local_140);
              if (local_144 == 0) {
                local_144 = sqlite3Fts5StorageDelete
                                      ((Fts5Storage *)pVtab[1].zErrMsg,iVar23,(sqlite3_value **)0x0)
                ;
              }
              iVar12 = local_144;
              if (local_144 == 0) {
                iVar12 = sqlite3Fts5StorageIndexInsert
                                   ((Fts5Storage *)pVtab[1].zErrMsg,apVal,(local_140->base).iRowid);
              }
              goto LAB_0019df1c;
            }
            local_144 = sqlite3Fts5StorageDelete(pFVar5,iVar23,(sqlite3_value **)0x0);
            pRowid = (sqlite_int64 *)local_140;
            if (local_144 == 0) {
              local_144 = sqlite3Fts5StorageDelete
                                    ((Fts5Storage *)pVtab[1].zErrMsg,iDel,(sqlite3_value **)0x0);
              pRowid = (sqlite_int64 *)local_140;
            }
          }
        }
        fts5StorageInsert(&local_144,(Fts5FullTable *)pVtab,apVal,pRowid);
        iVar12 = local_144;
      }
    }
    goto LAB_0019df1c;
  }
  pcVar19 = (char *)sqlite3ValueText(pVal,'\x01');
  if (((*(int *)&psVar4->xFilter != 0) && (pcVar19 != (char *)0x0)) &&
     (iVar12 = sqlite3StrICmp("delete",pcVar19), iVar12 == 0)) {
    pMVar22 = apVal[1];
    uVar13._0_2_ = pMVar22->flags;
    uVar13._2_1_ = pMVar22->enc;
    uVar13._3_1_ = pMVar22->eSubtype;
    iVar12 = 0;
    if ((0x50505050U >> (uVar13 & 0x1f) & 1) != 0) {
      iVar23 = sqlite3VdbeIntValue(pMVar22);
      iVar12 = sqlite3Fts5StorageDelete((Fts5Storage *)pVtab[1].zErrMsg,iVar23,apVal + 2);
    }
    goto LAB_0019df1c;
  }
  pMVar22 = apVal[(long)*(int *)&psVar4->xBestIndex + 3];
  psVar4 = pVtab[1].pModule;
  local_94 = 0;
  if (pcVar19 == (char *)0x0) {
LAB_0019d861:
    pFVar29 = *(Fts5Index **)&pVtab[1].nRef;
    pFVar20 = fts5StructureRead(pFVar29);
    fts5StructureRelease(pFVar20);
    iVar12 = pFVar29->rc;
    pFVar29->rc = 0;
    if (iVar12 == 0) {
      iVar12 = sqlite3Fts5ConfigSetValue((Fts5Config *)pVtab[1].pModule,pcVar19,pMVar22,&local_94);
    }
    if ((iVar12 == 0) && (iVar12 = 1, local_94 == 0)) {
      iVar12 = sqlite3Fts5StorageConfigValue((Fts5Storage *)pVtab[1].zErrMsg,pcVar19,pMVar22,0);
    }
    goto LAB_0019df1c;
  }
  iVar12 = sqlite3StrICmp("delete-all",pcVar19);
  if (iVar12 == 0) {
    if (*(int *)&psVar4->xFilter != 0) {
      iVar12 = sqlite3Fts5StorageDeleteAll((Fts5Storage *)pVtab[1].zErrMsg);
      goto LAB_0019df1c;
    }
    pcVar19 = "\'delete-all\' may only be used with a contentless or external content fts5 table";
  }
  else {
    iVar12 = sqlite3StrICmp("rebuild",pcVar19);
    if (iVar12 != 0) {
      iVar12 = sqlite3StrICmp("optimize",pcVar19);
      if (iVar12 == 0) {
        pFVar29 = *(Fts5Index **)(pVtab[1].zErrMsg + 8);
        ctx.iRowid = 0;
        fts5IndexFlush(pFVar29);
        pFVar20 = fts5StructureRead(pFVar29);
        if (pFVar29->pStruct != (Fts5Structure *)0x0) {
          fts5StructureRelease(pFVar29->pStruct);
          pFVar29->pStruct = (Fts5Structure *)0x0;
        }
        if (pFVar20 != (Fts5Structure *)0x0) {
          ctx.iRowid = (i64)fts5IndexOptimizeStruct(pFVar29,pFVar20);
        }
        fts5StructureRelease(pFVar20);
        if (ctx.iRowid != 0) {
          iVar12 = -1;
          lVar34 = 0;
          do {
            iVar12 = iVar12 + 1;
            piVar3 = (int *)(ctx.iRowid + 0x1c + lVar34);
            lVar34 = lVar34 + 0x10;
          } while (*piVar3 == 0);
          if (pFVar29->rc == 0) {
            do {
              if (*(int *)(ctx.iRowid + 0xc + lVar34) < 1) break;
              nRow = CONCAT44(nRow._4_4_,1000);
              fts5IndexMergeLevel(pFVar29,(Fts5Structure **)&ctx,iVar12,(int *)&nRow);
            } while (pFVar29->rc == 0);
          }
          pFVar20 = (Fts5Structure *)ctx.iRowid;
          fts5StructureWrite(pFVar29,(Fts5Structure *)ctx.iRowid);
LAB_0019df04:
          fts5StructureRelease(pFVar20);
        }
      }
      else {
        iVar12 = sqlite3StrICmp("merge",pcVar19);
        if (iVar12 != 0) {
          iVar12 = sqlite3StrICmp("integrity-check",pcVar19);
          if (iVar12 == 0) {
            pFVar5 = (Fts5Storage *)pVtab[1].zErrMsg;
            pFVar6 = pFVar5->pConfig;
            ctx.iRowid = 0;
            ctx.iCol = 0;
            ctx.szCol = 0;
            ctx.cksum = 0;
            ctx.pTermset = (Fts5Termset *)0x0;
            iVar12 = pFVar6->nCol;
            ctx.pConfig = pFVar6;
            iVar14 = sqlite3_initialize();
            if (iVar14 == 0) {
              __s = sqlite3Malloc((long)iVar12 * 0xc);
            }
            else {
              __s = (void *)0x0;
            }
            if (__s == (void *)0x0) {
              iVar12 = 7;
            }
            else {
              iVar14 = pFVar6->nCol;
              iVar15 = 0;
              memset(__s,0,(long)iVar14 * 8);
              iVar12 = fts5StorageGetStmt(pFVar5,10,&pScan,(char **)0x0);
              psVar30 = pScan;
              if (iVar12 == 0) {
                iVar12 = sqlite3_step(pScan);
                if (iVar12 == 100) {
                  local_140 = (Fts5Iter *)((long)__s + (long)iVar14 * 8);
                  iVar15 = 0;
                  do {
                    pMVar22 = columnMem(psVar30,0);
                    iVar23 = sqlite3VdbeIntValue(pMVar22);
                    columnMallocFailure(psVar30);
                    ctx._8_8_ = ctx._8_8_ & 0xffffffff;
                    ctx.iRowid = iVar23;
                    if (pFVar6->bColumnsize != 0) {
                      iVar15 = sqlite3Fts5StorageDocsize(pFVar5,iVar23,(int *)local_140);
                    }
                    if ((iVar15 == 0) && (iVar15 = 0, pFVar6->eDetail == 1)) {
                      nRow = nRow & 0xffffffff00000000;
                      ctx.pTermset = (Fts5Termset *)sqlite3Fts5MallocZero((int *)&nRow,0x1000);
                      iVar15 = (int)nRow;
                    }
                    psVar30 = pScan;
                    if (iVar15 != 0) {
LAB_0019e1d7:
                      sqlite3Fts5TermsetFree(ctx.pTermset);
                      ctx.pTermset = (Fts5Termset *)0x0;
                      break;
                    }
                    if (0 < pFVar6->nCol) {
                      uVar37 = 0;
                      do {
                        iVar15 = 0;
                        if (pFVar6->abUnindexed[uVar37] == '\0') {
                          ctx._8_8_ = uVar37 & 0xffffffff;
                          iVar15 = 0;
                          if (pFVar6->eDetail == 2) {
                            nRow = nRow & 0xffffffff00000000;
                            ctx.pTermset = (Fts5Termset *)sqlite3Fts5MallocZero((int *)&nRow,0x1000)
                            ;
                            iVar15 = (int)nRow;
                          }
                          if (iVar15 == 0) {
                            iVar12 = (int)uVar37 + 1;
                            puVar24 = sqlite3_column_text(psVar30,iVar12);
                            iVar12 = sqlite3_column_bytes(psVar30,iVar12);
                            if (puVar24 == (uchar *)0x0) {
                              iVar15 = 0;
                            }
                            else {
                              iVar15 = (*pFVar6->pTokApi->xTokenize)
                                                 (pFVar6->pTok,&ctx,4,(char *)puVar24,iVar12,
                                                  fts5StorageIntegrityCallback);
                            }
                          }
                          if (iVar15 == 0) {
                            if (pFVar6->bColumnsize == 0) {
                              iVar15 = 0;
                            }
                            else {
                              iVar15 = 0x10b;
                              if (ctx.szCol == *(int *)((long)local_140->aSeg + uVar37 * 4 + -0x60))
                              {
                                iVar15 = 0;
                              }
                            }
                          }
                          plVar1 = (long *)((long)__s + uVar37 * 8);
                          *plVar1 = *plVar1 + (long)ctx.szCol;
                          if (pFVar6->eDetail == 2) {
                            sqlite3Fts5TermsetFree(ctx.pTermset);
                            ctx.pTermset = (Fts5Termset *)0x0;
                          }
                        }
                        if (iVar15 != 0) goto LAB_0019e1d7;
                        uVar37 = uVar37 + 1;
                      } while ((long)uVar37 < (long)pFVar6->nCol);
                    }
                    sqlite3Fts5TermsetFree(ctx.pTermset);
                    psVar30 = pScan;
                    ctx.pTermset = (Fts5Termset *)0x0;
                    iVar12 = sqlite3_step(pScan);
                  } while (iVar12 == 100);
                }
                iVar12 = sqlite3_reset(pScan);
                if (iVar15 != 0) {
                  iVar12 = iVar15;
                }
              }
              if (((iVar12 == 0) && (iVar12 = fts5StorageLoadTotals(pFVar5,0), iVar12 == 0)) &&
                 (0 < pFVar6->nCol)) {
                lVar34 = 0;
                do {
                  piVar2 = pFVar5->aTotalSize + lVar34;
                  lVar7 = *(long *)((long)__s + lVar34 * 8);
                  if (*piVar2 != lVar7) break;
                  bVar38 = (ulong)(uint)pFVar6->nCol - 1 != lVar34;
                  lVar34 = lVar34 + 1;
                } while (bVar38);
                iVar12 = 0x10b;
                if (*piVar2 == lVar7) {
                  iVar12 = 0;
                }
              }
              if ((iVar12 == 0) && (iVar12 = 0, pFVar6->eContent == 0)) {
                nRow = 0;
                iVar12 = fts5StorageCount(pFVar5,"content",&nRow);
                if (iVar12 == 0) {
                  iVar12 = 0x10b;
                  if (nRow == pFVar5->nTotalRow) {
                    iVar12 = 0;
                  }
                }
              }
              if (iVar12 == 0) {
                if (pFVar6->bColumnsize == 0) {
                  iVar12 = 0;
                }
                else {
                  nRow = 0;
                  iVar12 = fts5StorageCount(pFVar5,"docsize",&nRow);
                  if (iVar12 == 0) {
                    iVar12 = 0x10b;
                    if (nRow == pFVar5->nTotalRow) {
                      iVar12 = 0;
                    }
                  }
                }
              }
              if (iVar12 == 0) {
                pFVar29 = pFVar5->pIndex;
                local_58 = ctx.cksum;
                local_78 = pFVar29->pConfig->eDetail;
                poslist.p = (u8 *)0x0;
                poslist.n = 0;
                poslist.nSpace = 0;
                local_a8 = fts5StructureRead(pFVar29);
                local_80 = pFVar29;
                if ((local_a8 != (Fts5Structure *)0x0) && (0 < local_a8->nLevel)) {
                  local_68 = local_a8->aLevel;
                  pFVar31 = (Fts5Iter *)&pFVar29->rc;
                  lVar34 = 0;
                  local_140 = pFVar31;
                  do {
                    local_50 = lVar34;
                    if (0 < local_68[lVar34].nSeg) {
                      pFVar32 = local_68 + lVar34;
                      lVar34 = 0;
                      local_48 = pFVar32;
                      do {
                        pStmt = (sqlite3_stmt *)0x0;
                        iVar12 = pFVar32->aSeg[lVar34].pgnoFirst;
                        if (iVar12 != 0) {
                          pFVar35 = pFVar32->aSeg + lVar34;
                          uVar37 = (ulong)(uint)pFVar35->pgnoLast;
                          local_90 = (ulong)(iVar12 - 1);
                          local_40 = lVar34;
                          pcVar19 = sqlite3_mprintf(
                                                  "SELECT segid, term, (pgno>>1), (pgno&1) FROM %Q.\'%q_idx\' WHERE segid=%d"
                                                  ,pFVar29->pConfig->zDb,pFVar29->pConfig->zName);
                          fts5IndexPrepareStmt(pFVar29,&pStmt,pcVar19);
                          local_60 = pFVar35;
                          do {
                            psVar30 = pStmt;
                            if (((int)(pFVar31->base).iRowid != 0) ||
                               (iVar12 = sqlite3_step(pStmt), iVar12 != 100)) break;
                            iVar12 = sqlite3_column_bytes(psVar30,1);
                            puVar24 = sqlite3_column_text(psVar30,1);
                            pMVar22 = columnMem(psVar30,2);
                            uVar25 = sqlite3VdbeIntValue(pMVar22);
                            columnMallocFailure(psVar30);
                            pMVar22 = columnMem(psVar30,3);
                            local_38 = sqlite3VdbeIntValue(pMVar22);
                            columnMallocFailure(psVar30);
                            if ((int)uVar25 < pFVar35->pgnoFirst) {
                              bVar38 = false;
                              pFVar31 = local_140;
                            }
                            else {
                              local_a0 = uVar25;
                              pFVar26 = fts5LeafRead(pFVar29,(long)(int)uVar25 +
                                                             ((ulong)(uint)pFVar35->iSegid << 0x25))
                              ;
                              bVar38 = true;
                              pFVar31 = local_140;
                              if (pFVar26 != (Fts5Data *)0x0) {
                                iVar14 = pFVar26->szLeaf;
                                if (iVar14 < pFVar26->nn) {
                                  puVar8 = (ushort *)pFVar26->p;
                                  sqlite3Fts5GetVarint32
                                            ((uchar *)((long)puVar8 + (long)iVar14),(u32 *)&nRow);
                                  iVar15 = (int)nRow;
                                  if (((int)nRow < iVar14) &&
                                     ((int)(uint)(ushort)(*puVar8 << 8 | *puVar8 >> 8) < (int)nRow))
                                  {
                                    iVar16 = sqlite3Fts5GetVarint32
                                                       ((uchar *)((long)puVar8 +
                                                                 (nRow & 0xffffffffU)),(u32 *)&nTerm
                                                       );
                                    iVar28 = nTerm - iVar12;
                                    iVar17 = nTerm;
                                    if (iVar12 <= nTerm) {
                                      iVar17 = iVar12;
                                    }
                                    if (iVar17 == 0) {
                                      iVar12 = 0;
                                    }
                                    else {
                                      iVar12 = memcmp((void *)((long)puVar8 +
                                                              (ulong)(uint)(iVar16 + iVar15)),
                                                      puVar24,(long)iVar17);
                                    }
                                    if (iVar12 != 0) {
                                      iVar28 = iVar12;
                                    }
                                    if (iVar28 < 0) goto LAB_0019e52c;
                                  }
                                  else {
LAB_0019e52c:
                                    *(int *)&(local_140->base).iRowid = 0x10b;
                                  }
                                  nRow = 0;
                                  uStack_130 = 0;
                                  buf2.p = (u8 *)0x0;
                                  buf2.n = 0;
                                  buf2.nSpace = 0;
                                  lVar34 = 0;
                                  pFVar31 = local_140;
                                  do {
                                    if ((int)(pFVar31->base).iRowid != 0) break;
                                    iVar17 = (int)lVar34;
                                    puVar9 = pFVar26->p;
                                    iVar15 = sqlite3Fts5GetVarint32(puVar9 + iVar14,(u32 *)&nIncr);
                                    lVar34 = (long)iVar17 + (long)nIncr;
                                    iVar12 = pFVar26->szLeaf;
                                    iVar28 = (int)lVar34;
                                    pFVar31 = local_140;
                                    if (iVar28 < iVar12) {
                                      if (iVar17 == 0) {
                                        iVar17 = sqlite3Fts5GetVarint32
                                                           (puVar9 + lVar34,(u32 *)&nKeep);
                                        pFVar31 = local_140;
                                        if (iVar12 < iVar17 + iVar28 + nKeep) {
                                          *(int *)&(local_140->base).iRowid = 0x10b;
                                        }
                                        else {
                                          uStack_130 = uStack_130 & 0xffffffff00000000;
                                          sqlite3Fts5BufferAppendBlob
                                                    ((int *)local_140,(Fts5Buffer *)&nRow,nKeep,
                                                     puVar9 + (iVar17 + iVar28));
                                        }
                                      }
                                      else {
                                        iVar17 = sqlite3Fts5GetVarint32
                                                           (puVar9 + iVar28,(u32 *)&nKeep);
                                        iVar16 = sqlite3Fts5GetVarint32
                                                           (puVar9 + (iVar17 + iVar28),&local_70);
                                        pFVar31 = local_140;
                                        if (((int)(u32)uStack_130 < nKeep) ||
                                           (iVar16 = iVar17 + iVar28 + iVar16,
                                           iVar12 < (int)(local_70 + iVar16))) {
                                          *(int *)&(local_140->base).iRowid = 0x10b;
                                        }
                                        else {
                                          uStack_130 = CONCAT44(uStack_130._4_4_,nKeep);
                                          sqlite3Fts5BufferAppendBlob
                                                    ((int *)local_140,(Fts5Buffer *)&nRow,local_70,
                                                     puVar9 + iVar16);
                                        }
                                        if ((int)(pFVar31->base).iRowid == 0) {
                                          iVar17 = (u32)uStack_130 - buf2.n;
                                          iVar12 = buf2.n;
                                          if ((int)(u32)uStack_130 < buf2.n) {
                                            iVar12 = (u32)uStack_130;
                                          }
                                          if (iVar12 == 0) {
                                            iVar12 = 0;
                                          }
                                          else {
                                            iVar12 = memcmp((void *)nRow,buf2.p,(long)iVar12);
                                          }
                                          if (iVar12 != 0) {
                                            iVar17 = iVar12;
                                          }
                                          if (iVar17 < 1) goto LAB_0019e5ef;
                                        }
                                      }
                                    }
                                    else {
LAB_0019e5ef:
                                      *(int *)&(pFVar31->base).iRowid = 0x10b;
                                    }
                                    iVar14 = iVar14 + iVar15;
                                    buf2._8_8_ = buf2._8_8_ & 0xffffffff00000000;
                                    sqlite3Fts5BufferAppendBlob
                                              ((int *)pFVar31,&buf2,(u32)uStack_130,(u8 *)nRow);
                                  } while (iVar14 < pFVar26->nn);
                                  sqlite3_free((void *)nRow);
                                  nRow = 0;
                                  uStack_130._0_4_ = 0;
                                  uStack_130._4_4_ = 0;
                                  sqlite3_free(buf2.p);
                                  pFVar29 = local_80;
                                }
                                else {
                                  *(int *)&(local_140->base).iRowid = 0x10b;
                                }
                                sqlite3_free(pFVar26);
                                pFVar35 = local_60;
                                if ((int)(pFVar31->base).iRowid == 0) {
                                  iVar12 = (int)local_a0 + -1;
                                  if ((int)local_90 < iVar12) {
                                    lVar34 = (long)((int)local_90 + 1);
                                    do {
                                      pFVar26 = fts5DataRead(pFVar29,((ulong)(uint)pFVar35->iSegid
                                                                     << 0x25) + lVar34);
                                      if (pFVar26 != (Fts5Data *)0x0) {
                                        if (pFVar26->szLeaf < pFVar26->nn) {
                                          *(int *)&(pFVar31->base).iRowid = 0x10b;
                                        }
                                        if (((int)uVar37 + 1 <= lVar34) &&
                                           (pFVar26->p[1] != '\0' || *pFVar26->p != '\0')) {
                                          *(int *)&(pFVar31->base).iRowid = 0x10b;
                                        }
                                      }
                                      sqlite3_free(pFVar26);
                                    } while ((lVar34 < iVar12) &&
                                            (lVar34 = lVar34 + 1, (int)(pFVar31->base).iRowid == 0))
                                    ;
                                  }
                                  bVar38 = true;
                                  if ((int)(pFVar31->base).iRowid == 0) {
                                    if ((int)local_38 == 0) {
                                      uVar37 = (ulong)(uint)pFVar35->pgnoLast;
                                      bVar38 = false;
                                      local_90 = local_a0;
                                    }
                                    else {
                                      uVar13 = pFVar35->iSegid;
                                      uVar37 = 0;
                                      pIter = fts5DlidxIterInit(pFVar29,0,uVar13,(int)local_a0);
                                      if ((pFVar29->rc == 0) && (pIter->aLvl[0].bEof == 0)) {
                                        lVar34 = (ulong)uVar13 << 0x25;
                                        uVar25 = local_a0;
                                        do {
                                          uVar36 = (int)uVar25 + 1;
                                          uVar37 = (ulong)uVar36;
                                          uVar13 = pIter->aLvl[0].iLeafPgno;
                                          uVar25 = (ulong)uVar13;
                                          if ((int)uVar36 < (int)uVar13) {
                                            uVar37 = (ulong)(int)uVar36;
                                            do {
                                              pFVar26 = fts5DataRead(pFVar29,lVar34 + uVar37);
                                              if (pFVar26 != (Fts5Data *)0x0) {
                                                if (pFVar26->p[1] != '\0' || *pFVar26->p != '\0') {
                                                  *(int *)&(pFVar31->base).iRowid = 0x10b;
                                                }
                                                sqlite3_free(pFVar26);
                                              }
                                              uVar37 = uVar37 + 1;
                                              uVar25 = (ulong)pIter->aLvl[0].iLeafPgno;
                                            } while ((long)uVar37 < (long)uVar25);
                                          }
                                          pFVar26 = fts5DataRead(pFVar29,(int)uVar25 + lVar34);
                                          if (pFVar26 != (Fts5Data *)0x0) {
                                            uVar11 = *(ushort *)pFVar26->p;
                                            uVar11 = uVar11 << 8 | uVar11 >> 8;
                                            if ((pFVar26->szLeaf <= (int)(uint)uVar11) ||
                                               (sqlite3Fts5GetVarint
                                                          ((uchar *)((long)pFVar26->p +
                                                                    (ulong)uVar11),(u64 *)&nRow),
                                               nRow != pIter->aLvl[0].iRowid)) {
                                              *(int *)&(pFVar31->base).iRowid = 0x10b;
                                            }
                                            sqlite3_free(pFVar26);
                                          }
                                          fts5DlidxIterNextR(pFVar29,pIter,0);
                                        } while ((pFVar29->rc == 0) && (pIter->aLvl[0].bEof == 0));
                                      }
                                      fts5DlidxIterFree(pIter);
                                      bVar38 = false;
                                      local_90 = local_a0;
                                      pFVar35 = local_60;
                                    }
                                  }
                                }
                                else {
                                  bVar38 = true;
                                }
                              }
                            }
                          } while (!bVar38);
                          iVar12 = sqlite3_finalize(pStmt);
                          pFVar32 = local_48;
                          lVar34 = local_40;
                          if ((int)(pFVar31->base).iRowid == 0) {
                            *(int *)&(pFVar31->base).iRowid = iVar12;
                          }
                        }
                        lVar34 = lVar34 + 1;
                      } while (lVar34 < pFVar32->nSeg);
                    }
                    lVar34 = local_50 + 1;
                  } while (lVar34 < local_a8->nLevel);
                }
                uVar37 = 0;
                fts5MultiIterNew(pFVar29,local_a8,0x20,(Fts5Colset *)0x0,(u8 *)0x0,0,-1,0,
                                 (Fts5Iter **)&nRow);
                iVar23 = nRow;
                pFVar31 = (Fts5Iter *)nRow;
                if (pFVar29->rc == 0) {
                  lVar34 = nRow + 0x60;
                  bVar38 = true;
                  uVar37 = 0;
                  local_140 = (Fts5Iter *)nRow;
                  do {
                    if ((pFVar31->base).bEof != '\0') break;
                    buf2.p = (u8 *)0x0;
                    pStmt = (sqlite3_stmt *)((ulong)pStmt & 0xffffffff00000000);
                    lVar33 = (ulong)pFVar31->aFirst[1].iFirst * 0x78;
                    lVar7 = *(long *)(iVar23 + 200 + lVar33);
                    uVar13 = *(uint *)(iVar23 + 0xc0 + lVar33);
                    lVar10 = *(long *)(iVar23 + 0xb8 + lVar33);
                    if (local_78 == 1) {
                      if (((!bVar38) || (lVar33 = lVar33 + lVar34, *(long *)(lVar33 + 0x10) == 0))
                         || (*(int *)(lVar33 + 0x70) != 0)) {
                        uVar25 = lVar7 * 0x51;
                        if (0 < (int)uVar13) {
                          uVar27 = 0;
                          do {
                            uVar25 = uVar25 * 9 + (long)*(char *)(lVar10 + uVar27);
                            uVar27 = uVar27 + 1;
                          } while (uVar13 != uVar27);
                        }
                        uVar37 = uVar37 ^ uVar25;
                      }
                    }
                    else {
                      poslist._8_8_ = poslist._8_8_ & 0xffffffff00000000;
                      fts5SegiterPoslist(local_80,(Fts5SegIter *)(lVar33 + lVar34),(Fts5Colset *)0x0
                                         ,&poslist);
                      puVar9 = poslist.p;
                      iVar12 = poslist.n;
                      iVar14 = sqlite3Fts5PoslistNext64
                                         (poslist.p,poslist.n,(int *)&pStmt,(i64 *)&buf2);
                      if (iVar14 == 0) {
                        do {
                          uVar25 = (ulong)((uint)buf2.p & 0x7fffffff) +
                                   (((long)buf2.p >> 0x20) + lVar7 * 9) * 9;
                          if (0 < (int)uVar13) {
                            uVar27 = 0;
                            do {
                              uVar25 = uVar25 * 9 + (long)*(char *)(lVar10 + uVar27);
                              uVar27 = uVar27 + 1;
                            } while (uVar13 != uVar27);
                          }
                          uVar37 = uVar37 ^ uVar25;
                          iVar14 = sqlite3Fts5PoslistNext64
                                             (puVar9,iVar12,(int *)&pStmt,(i64 *)&buf2);
                        } while (iVar14 == 0);
                      }
                    }
                    pFVar29 = local_80;
                    pFVar31 = local_140;
                    fts5MultiIterNext(local_80,local_140,0,0);
                    bVar38 = pFVar29->rc == 0;
                  } while (bVar38);
                }
                fts5MultiIterFree(pFVar31);
                if ((pFVar29->rc == 0) && (uVar37 != local_58)) {
                  pFVar29->rc = 0x10b;
                }
                fts5StructureRelease(local_a8);
                sqlite3_free(poslist.p);
                poslist.p = (u8 *)0x0;
                poslist.n = 0;
                poslist.nSpace = 0;
                iVar12 = pFVar29->rc;
                pFVar29->rc = 0;
              }
              sqlite3_free(__s);
            }
            goto LAB_0019df1c;
          }
          goto LAB_0019d861;
        }
        iVar23 = sqlite3VdbeIntValue(pMVar22);
        iVar12 = (int)iVar23;
        pFVar29 = *(Fts5Index **)(pVtab[1].zErrMsg + 8);
        pFVar20 = fts5StructureRead(pFVar29);
        if (pFVar20 != (Fts5Structure *)0x0) {
          iVar14 = pFVar29->pConfig->nUsermerge;
          ctx.iRowid = (i64)pFVar20;
          if (pFVar29->pStruct != (Fts5Structure *)0x0) {
            fts5StructureRelease(pFVar29->pStruct);
            pFVar29->pStruct = (Fts5Structure *)0x0;
          }
          if (iVar12 < 0) {
            pFVar21 = fts5IndexOptimizeStruct(pFVar29,pFVar20);
            fts5StructureRelease(pFVar20);
            iVar12 = -iVar12;
            iVar14 = 2;
            ctx.iRowid = (i64)pFVar21;
          }
          pFVar20 = (Fts5Structure *)ctx.iRowid;
          if (((ctx.iRowid != 0) && (*(int *)(ctx.iRowid + 0x14) != 0)) &&
             (iVar12 = fts5IndexMerge(pFVar29,(Fts5Structure **)&ctx,iVar12,iVar14),
             pFVar20 = (Fts5Structure *)ctx.iRowid, iVar12 != 0)) {
            fts5StructureWrite(pFVar29,(Fts5Structure *)ctx.iRowid);
            pFVar20 = (Fts5Structure *)ctx.iRowid;
          }
          goto LAB_0019df04;
        }
      }
      iVar12 = pFVar29->rc;
      pFVar29->rc = 0;
      goto LAB_0019df1c;
    }
    if (*(int *)&psVar4->xFilter != 1) {
      pFVar5 = (Fts5Storage *)pVtab[1].zErrMsg;
      ctx.iRowid = 0;
      ctx.iCol = 0;
      ctx.szCol = 0;
      pFVar6 = pFVar5->pConfig;
      buf2.p = (u8 *)0x0;
      uStack_130 = 0;
      nRow = (i64)pFVar5;
      iVar12 = sqlite3Fts5StorageDeleteAll(pFVar5);
      poslist.p = (u8 *)CONCAT44(poslist.p._4_4_,iVar12);
      if (iVar12 == 0) {
        iVar12 = fts5StorageLoadTotals(pFVar5,1);
        poslist.p = (u8 *)CONCAT44(poslist.p._4_4_,iVar12);
      }
      if ((int)poslist.p == 0) {
        iVar12 = fts5StorageGetStmt(pFVar5,10,(sqlite3_stmt **)&buf2,(char **)0x0);
        poslist.p = (u8 *)CONCAT44(poslist.p._4_4_,iVar12);
      }
      puVar9 = buf2.p;
      bVar38 = (int)poslist.p == 0;
      if (bVar38) {
        iVar12 = sqlite3_step((sqlite3_stmt *)buf2.p);
        if (iVar12 == 100) {
          do {
            pMVar22 = columnMem((sqlite3_stmt *)puVar9,0);
            iVar23 = sqlite3VdbeIntValue(pMVar22);
            columnMallocFailure((sqlite3_stmt *)puVar9);
            ctx._8_8_ = ctx._8_8_ & 0xffffffff00000000;
            iVar12 = sqlite3Fts5IndexBeginWrite(pFVar5->pIndex,0,iVar23);
            poslist.p = (u8 *)CONCAT44(poslist.p._4_4_,iVar12);
            uStack_130 = uStack_130 & 0xffffffff00000000;
            if (iVar12 == 0) {
              if (0 < pFVar6->nCol) {
                iVar12 = 0;
                do {
                  uStack_130 = uStack_130 & 0xffffffff;
                  if (pFVar6->abUnindexed[iVar12] == '\0') {
                    puVar24 = sqlite3_column_text((sqlite3_stmt *)puVar9,iVar12 + 1);
                    iVar12 = sqlite3_column_bytes((sqlite3_stmt *)puVar9,(u32)uStack_130 + 1);
                    if (puVar24 == (uchar *)0x0) {
                      iVar12 = 0;
                    }
                    else {
                      iVar12 = (*pFVar6->pTokApi->xTokenize)
                                         (pFVar6->pTok,&nRow,4,(char *)puVar24,iVar12,
                                          fts5StorageInsertCallback);
                    }
                    poslist.p = (u8 *)CONCAT44(poslist.p._4_4_,iVar12);
                  }
                  sqlite3Fts5BufferAppendVarint
                            ((int *)&poslist,(Fts5Buffer *)&ctx,(long)uStack_130._4_4_);
                  pFVar5->aTotalSize[(int)(u32)uStack_130] =
                       pFVar5->aTotalSize[(int)(u32)uStack_130] + (long)uStack_130._4_4_;
                  iVar12 = (u32)uStack_130 + 1;
                  uStack_130 = CONCAT44(uStack_130._4_4_,iVar12);
                  if ((int)poslist.p != 0) goto LAB_0019dce2;
                } while (iVar12 < pFVar6->nCol);
              }
              pFVar5->nTotalRow = pFVar5->nTotalRow + 1;
              iVar12 = fts5StorageInsertDocsize(pFVar5,iVar23,(Fts5Buffer *)&ctx);
              poslist.p = (u8 *)CONCAT44(poslist.p._4_4_,iVar12);
            }
            else {
LAB_0019dce2:
              pFVar5->nTotalRow = pFVar5->nTotalRow + 1;
            }
            bVar38 = (int)poslist.p == 0;
            if (!bVar38) goto LAB_0019ddcb;
            iVar12 = sqlite3_step((sqlite3_stmt *)puVar9);
          } while (iVar12 == 100);
        }
        bVar38 = true;
      }
LAB_0019ddcb:
      sqlite3_free((void *)ctx.iRowid);
      iVar12 = sqlite3_reset((sqlite3_stmt *)buf2.p);
      if (bVar38) {
        poslist.p = (u8 *)CONCAT44(poslist.p._4_4_,iVar12);
      }
      if ((int)poslist.p == 0) {
        uVar13 = fts5StorageSaveTotals(pFVar5);
        poslist.p = (u8 *)(ulong)uVar13;
      }
      iVar12 = (int)poslist.p;
      goto LAB_0019df1c;
    }
    pcVar19 = "\'rebuild\' may not be used with a contentless fts5 table";
  }
  fts5SetVtabError((Fts5FullTable *)pVtab,pcVar19);
  iVar12 = 1;
LAB_0019df1c:
  local_144 = iVar12;
  (pVtab[1].pModule)->xSavepoint = (_func_int_sqlite3_vtab_ptr_int *)0x0;
  return local_144;
}

Assistant:

static int fts5UpdateMethod(
  sqlite3_vtab *pVtab,            /* Virtual table handle */
  int nArg,                       /* Size of argument array */
  sqlite3_value **apVal,          /* Array of arguments */
  sqlite_int64 *pRowid            /* OUT: The affected (or effected) rowid */
){
  Fts5FullTable *pTab = (Fts5FullTable*)pVtab;
  Fts5Config *pConfig = pTab->p.pConfig;
  int eType0;                     /* value_type() of apVal[0] */
  int rc = SQLITE_OK;             /* Return code */

  /* A transaction must be open when this is called. */
  assert( pTab->ts.eState==1 );

  assert( pVtab->zErrMsg==0 );
  assert( nArg==1 || nArg==(2+pConfig->nCol+2) );
  assert( sqlite3_value_type(apVal[0])==SQLITE_INTEGER 
       || sqlite3_value_type(apVal[0])==SQLITE_NULL 
  );
  assert( pTab->p.pConfig->pzErrmsg==0 );
  pTab->p.pConfig->pzErrmsg = &pTab->p.base.zErrMsg;

  /* Put any active cursors into REQUIRE_SEEK state. */
  fts5TripCursors(pTab);

  eType0 = sqlite3_value_type(apVal[0]);
  if( eType0==SQLITE_NULL 
   && sqlite3_value_type(apVal[2+pConfig->nCol])!=SQLITE_NULL 
  ){
    /* A "special" INSERT op. These are handled separately. */
    const char *z = (const char*)sqlite3_value_text(apVal[2+pConfig->nCol]);
    if( pConfig->eContent!=FTS5_CONTENT_NORMAL 
      && 0==sqlite3_stricmp("delete", z) 
    ){
      rc = fts5SpecialDelete(pTab, apVal);
    }else{
      rc = fts5SpecialInsert(pTab, z, apVal[2 + pConfig->nCol + 1]);
    }
  }else{
    /* A regular INSERT, UPDATE or DELETE statement. The trick here is that
    ** any conflict on the rowid value must be detected before any 
    ** modifications are made to the database file. There are 4 cases:
    **
    **   1) DELETE
    **   2) UPDATE (rowid not modified)
    **   3) UPDATE (rowid modified)
    **   4) INSERT
    **
    ** Cases 3 and 4 may violate the rowid constraint.
    */
    int eConflict = SQLITE_ABORT;
    if( pConfig->eContent==FTS5_CONTENT_NORMAL ){
      eConflict = sqlite3_vtab_on_conflict(pConfig->db);
    }

    assert( eType0==SQLITE_INTEGER || eType0==SQLITE_NULL );
    assert( nArg!=1 || eType0==SQLITE_INTEGER );

    /* Filter out attempts to run UPDATE or DELETE on contentless tables.
    ** This is not suported.  */
    if( eType0==SQLITE_INTEGER && fts5IsContentless(pTab) ){
      pTab->p.base.zErrMsg = sqlite3_mprintf(
          "cannot %s contentless fts5 table: %s", 
          (nArg>1 ? "UPDATE" : "DELETE from"), pConfig->zName
      );
      rc = SQLITE_ERROR;
    }

    /* DELETE */
    else if( nArg==1 ){
      i64 iDel = sqlite3_value_int64(apVal[0]);  /* Rowid to delete */
      rc = sqlite3Fts5StorageDelete(pTab->pStorage, iDel, 0);
    }

    /* INSERT or UPDATE */
    else{
      int eType1 = sqlite3_value_numeric_type(apVal[1]);

      if( eType1!=SQLITE_INTEGER && eType1!=SQLITE_NULL ){
        rc = SQLITE_MISMATCH;
      }

      else if( eType0!=SQLITE_INTEGER ){     
        /* If this is a REPLACE, first remove the current entry (if any) */
        if( eConflict==SQLITE_REPLACE && eType1==SQLITE_INTEGER ){
          i64 iNew = sqlite3_value_int64(apVal[1]);  /* Rowid to delete */
          rc = sqlite3Fts5StorageDelete(pTab->pStorage, iNew, 0);
        }
        fts5StorageInsert(&rc, pTab, apVal, pRowid);
      }

      /* UPDATE */
      else{
        i64 iOld = sqlite3_value_int64(apVal[0]);  /* Old rowid */
        i64 iNew = sqlite3_value_int64(apVal[1]);  /* New rowid */
        if( eType1==SQLITE_INTEGER && iOld!=iNew ){
          if( eConflict==SQLITE_REPLACE ){
            rc = sqlite3Fts5StorageDelete(pTab->pStorage, iOld, 0);
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageDelete(pTab->pStorage, iNew, 0);
            }
            fts5StorageInsert(&rc, pTab, apVal, pRowid);
          }else{
            rc = sqlite3Fts5StorageContentInsert(pTab->pStorage, apVal, pRowid);
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageDelete(pTab->pStorage, iOld, 0);
            }
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageIndexInsert(pTab->pStorage, apVal,*pRowid);
            }
          }
        }else{
          rc = sqlite3Fts5StorageDelete(pTab->pStorage, iOld, 0);
          fts5StorageInsert(&rc, pTab, apVal, pRowid);
        }
      }
    }
  }

  pTab->p.pConfig->pzErrmsg = 0;
  return rc;
}